

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParamConstraint.hpp
# Opt level: O2

bool __thiscall
OpenMD::EqualIgnoreCaseConstraint::operator()(EqualIgnoreCaseConstraint *this,string *data)

{
  __type_conflict _Var1;
  locale *in_RCX;
  undefined1 local_40 [40];
  
  std::locale::locale((locale *)local_40);
  toUpperCopy<std::__cxx11::string>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_40 + 8),
             (OpenMD *)data,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40,in_RCX);
  _Var1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          (local_40 + 8),&this->rhs_);
  std::__cxx11::string::~string((string *)(local_40 + 8));
  std::locale::~locale((locale *)local_40);
  return _Var1;
}

Assistant:

bool operator()(std::string data) const {
      return OpenMD::toUpperCopy(data) == rhs_;
    }